

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

ptls_t * ptls_new(ptls_context_t *ctx,char *server_name)

{
  ptls_t *tls;
  char *pcVar1;
  
  tls = (ptls_t *)malloc(0x130);
  if (tls != (ptls_t *)0x0) {
    memset(&tls->state,0,0x128);
    tls->ctx = ctx;
    if (server_name == (char *)0x0) {
      tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
      return tls;
    }
    pcVar1 = strdup(server_name);
    tls->server_name = pcVar1;
    if (pcVar1 != (char *)0x0) {
      return tls;
    }
    ptls_free(tls);
  }
  return (ptls_t *)0x0;
}

Assistant:

ptls_t *ptls_new(ptls_context_t *ctx, const char *server_name)
{
    ptls_t *tls;

    if ((tls = malloc(sizeof(*tls))) == NULL)
        return NULL;

    *tls = (ptls_t){ctx};
    if (server_name != NULL) {
        tls->state = PTLS_STATE_CLIENT_HANDSHAKE_START;
        if ((tls->server_name = strdup(server_name)) == NULL)
            goto Fail;
    } else {
        tls->state = PTLS_STATE_SERVER_EXPECT_CLIENT_HELLO;
    }

    return tls;

Fail:
    ptls_free(tls);
    return NULL;
}